

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server.cxx
# Opt level: O3

void __thiscall cornerstone::raft_server::raft_server(raft_server *this,context *ctx)

{
  ptr<srv_state> *ppVar1;
  ptr<log_store> *ppVar2;
  int32 iVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  raft_params *prVar5;
  ulong uVar6;
  element_type *peVar7;
  element_type *peVar8;
  element_type *peVar9;
  int iVar10;
  uint uVar11;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var12;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  size_t sVar13;
  uint uVar14;
  srv_state *__tmp;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var15;
  long *plVar16;
  list<std::shared_ptr<cornerstone::srv_config>,_std::allocator<std::shared_ptr<cornerstone::srv_config>_>_>
  *plVar17;
  ulong uVar18;
  thread commiting_thread;
  random_device rd;
  peer *local_1488;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_1480 [2];
  undefined1 local_1469;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **local_1468;
  peer *local_1460;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *ap_Stack_1458 [2];
  function<int_()> *local_1448;
  _Hashtable<int,std::pair<int_const,std::shared_ptr<cornerstone::peer>>,std::allocator<std::pair<int_const,std::shared_ptr<cornerstone::peer>>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  *local_1440;
  condition_variable *local_1438;
  condition_variable *local_1430;
  _Any_data local_1428;
  _Manager_type local_1418;
  _Invoker_type local_1410;
  char *local_1408;
  char *local_13c0;
  random_device local_13b8;
  
  this->_vptr_raft_server = (_func_int **)&PTR__raft_server_001789c0;
  this->leader_ = -1;
  iVar10 = (*((ctx->state_mgr_).
              super___shared_ptr<cornerstone::state_mgr,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             _vptr_state_mgr[7])();
  this->id_ = iVar10;
  this->votes_granted_ = 0;
  iVar10 = (*((ctx->state_machine_).
              super___shared_ptr<cornerstone::state_machine,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             _vptr_state_machine[9])();
  this->quick_commit_idx_ = CONCAT44(extraout_var,iVar10);
  iVar10 = (*((ctx->state_machine_).
              super___shared_ptr<cornerstone::state_machine,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             _vptr_state_machine[9])();
  this->sm_commit_index_ = CONCAT44(extraout_var_00,iVar10);
  this->election_completed_ = true;
  this->config_changing_ = false;
  this->catching_up_ = false;
  this->stopping_ = false;
  this->steps_to_down_ = 0;
  this->snp_in_progress_ = (__atomic_base<bool>)0x0;
  (this->ctx_)._M_t.
  super___uniq_ptr_impl<cornerstone::context,_std::default_delete<cornerstone::context>_>._M_t.
  super__Tuple_impl<0UL,_cornerstone::context_*,_std::default_delete<cornerstone::context>_>.
  super__Head_base<0UL,_cornerstone::context_*,_false>._M_head_impl = ctx;
  (this->scheduler_).
  super___shared_ptr<cornerstone::delayed_task_scheduler,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (ctx->scheduler_).
       super___shared_ptr<cornerstone::delayed_task_scheduler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var4 = (ctx->scheduler_).
           super___shared_ptr<cornerstone::delayed_task_scheduler,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->scheduler_).
  super___shared_ptr<cornerstone::delayed_task_scheduler,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var4;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
    }
  }
  *(undefined8 *)((long)&(this->election_exec_).super__Function_base._M_functor + 8) = 0;
  *(raft_server **)&(this->election_exec_).super__Function_base._M_functor = this;
  (this->election_exec_)._M_invoker =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/datatechnology[P]cornerstone/src/raft_server.cxx:63:22)>
       ::_M_invoke;
  (this->election_exec_).super__Function_base._M_manager =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/datatechnology[P]cornerstone/src/raft_server.cxx:63:22)>
       ::_M_manager;
  local_1440 = (_Hashtable<int,std::pair<int_const,std::shared_ptr<cornerstone::peer>>,std::allocator<std::pair<int_const,std::shared_ptr<cornerstone::peer>>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)&this->peers_;
  (this->peers_)._M_h._M_buckets = (__buckets_ptr)0x0;
  (this->peers_)._M_h._M_bucket_count = 0;
  *(undefined8 *)&(this->peers_)._M_h._M_rehash_policy = 0;
  (this->election_task_).super___shared_ptr<cornerstone::delayed_task,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->election_task_).super___shared_ptr<cornerstone::delayed_task,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->peers_)._M_h._M_buckets = &(this->peers_)._M_h._M_single_bucket;
  (this->peers_)._M_h._M_bucket_count = 1;
  (this->peers_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->peers_)._M_h._M_element_count = 0;
  (this->peers_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  *(undefined8 *)((long)&(this->peers_lock_).super___shared_timed_mutex_base._M_rwlock + 0x30) = 0;
  (this->rpc_clients_)._M_h._M_buckets = (__buckets_ptr)0x0;
  (this->rpc_clients_)._M_h._M_bucket_count = 0;
  (this->rpc_clients_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->rpc_clients_)._M_h._M_element_count = 0;
  *(undefined8 *)&(this->rpc_clients_)._M_h._M_rehash_policy = 0;
  (this->peers_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->peers_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->peers_lock_).super___shared_timed_mutex_base._M_rwlock.__align = 0;
  *(undefined8 *)((long)&(this->peers_lock_).super___shared_timed_mutex_base._M_rwlock + 8) = 0;
  *(undefined8 *)((long)&(this->peers_lock_).super___shared_timed_mutex_base._M_rwlock + 0x10) = 0;
  *(undefined8 *)((long)&(this->peers_lock_).super___shared_timed_mutex_base._M_rwlock + 0x18) = 0;
  *(undefined8 *)((long)&(this->peers_lock_).super___shared_timed_mutex_base._M_rwlock + 0x20) = 0;
  (this->peers_lock_).super___shared_timed_mutex_base._M_rwlock.__data.__pad2 = 0;
  (this->rpc_clients_)._M_h._M_buckets = &(this->rpc_clients_)._M_h._M_single_bucket;
  (this->rpc_clients_)._M_h._M_bucket_count = 1;
  (this->rpc_clients_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->rpc_clients_)._M_h._M_element_count = 0;
  (this->rpc_clients_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->rpc_clients_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->rpc_clients_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this->role_ = follower;
  ppVar1 = &this->state_;
  (*((ctx->state_mgr_).super___shared_ptr<cornerstone::state_mgr,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    )->_vptr_state_mgr[5])(ppVar1);
  ppVar2 = &this->log_store_;
  (*((ctx->state_mgr_).super___shared_ptr<cornerstone::state_mgr,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    )->_vptr_state_mgr[6])(ppVar2);
  (this->state_machine_).super___shared_ptr<cornerstone::state_machine,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (ctx->state_machine_).
           super___shared_ptr<cornerstone::state_machine,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var4 = (ctx->state_machine_).
           super___shared_ptr<cornerstone::state_machine,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  (this->state_machine_).super___shared_ptr<cornerstone::state_machine,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var4;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
    }
  }
  (this->l_).super___shared_ptr<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (ctx->logger_).super___shared_ptr<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var4 = (ctx->logger_).super___shared_ptr<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->l_).super___shared_ptr<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var4;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
    }
  }
  local_1448 = &this->rand_timeout_;
  (this->rand_timeout_).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->rand_timeout_)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->rand_timeout_).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->rand_timeout_).super__Function_base._M_functor + 8) = 0;
  (*((ctx->state_mgr_).super___shared_ptr<cornerstone::state_mgr,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    )->_vptr_state_mgr[2])(&this->config_);
  *(undefined8 *)((long)&(this->lock_).super___recursive_mutex_base._M_mutex + 0x10) = 0;
  (this->lock_).super___recursive_mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->lock_).super___recursive_mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->lock_).super___recursive_mutex_base._M_mutex + 8) = 0;
  (this->conf_to_add_).super___shared_ptr<cornerstone::srv_config,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->conf_to_add_).super___shared_ptr<cornerstone::srv_config,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->srv_to_join_).super___shared_ptr<cornerstone::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->srv_to_join_).super___shared_ptr<cornerstone::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->lock_).super___recursive_mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->lock_).super___recursive_mutex_base._M_mutex.__data.__kind = 1;
  local_1430 = &this->commit_cv_;
  (this->commit_lock_).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->commit_lock_).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->commit_lock_).super___mutex_base._M_mutex + 0x10) = 0;
  (this->commit_lock_).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->commit_lock_).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->rpc_clients_lock_).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->rpc_clients_lock_).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->rpc_clients_lock_).super___mutex_base._M_mutex + 0x10) = 0;
  (this->rpc_clients_lock_).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->rpc_clients_lock_).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  std::condition_variable::condition_variable(local_1430);
  local_1438 = &this->ready_to_stop_cv_;
  (this->stopping_lock_).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  *(undefined8 *)((long)&(this->stopping_lock_).super___mutex_base._M_mutex + 0x10) = 0;
  (this->stopping_lock_).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->stopping_lock_).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->stopping_lock_).super___mutex_base._M_mutex + 8) = 0;
  std::condition_variable::condition_variable(local_1438);
  *(undefined8 *)((long)&(this->resp_handler_).super__Function_base._M_functor + 8) = 0;
  *(raft_server **)&(this->resp_handler_).super__Function_base._M_functor = this;
  (this->resp_handler_)._M_invoker =
       std::
       _Function_handler<void_(std::shared_ptr<cornerstone::resp_msg>_&,_const_std::shared_ptr<cornerstone::rpc_exception>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/datatechnology[P]cornerstone/src/raft_server.cxx:82:21)>
       ::_M_invoke;
  (this->resp_handler_).super__Function_base._M_manager =
       std::
       _Function_handler<void_(std::shared_ptr<cornerstone::resp_msg>_&,_const_std::shared_ptr<cornerstone::rpc_exception>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/datatechnology[P]cornerstone/src/raft_server.cxx:82:21)>
       ::_M_manager;
  *(undefined8 *)((long)&(this->ex_resp_handler_).super__Function_base._M_functor + 8) = 0;
  *(raft_server **)&(this->ex_resp_handler_).super__Function_base._M_functor = this;
  (this->ex_resp_handler_)._M_invoker =
       std::
       _Function_handler<void_(std::shared_ptr<cornerstone::resp_msg>_&,_const_std::shared_ptr<cornerstone::rpc_exception>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/datatechnology[P]cornerstone/src/raft_server.cxx:83:24)>
       ::_M_invoke;
  (this->ex_resp_handler_).super__Function_base._M_manager =
       std::
       _Function_handler<void_(std::shared_ptr<cornerstone::resp_msg>_&,_const_std::shared_ptr<cornerstone::rpc_exception>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/datatechnology[P]cornerstone/src/raft_server.cxx:83:24)>
       ::_M_manager;
  (*((ctx->state_machine_).
     super___shared_ptr<cornerstone::state_machine,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _vptr_state_machine[8])(&this->last_snapshot_);
  *(undefined8 *)&(this->voted_servers_)._M_h._M_rehash_policy = 0;
  (this->voted_servers_)._M_h._M_buckets = &(this->voted_servers_)._M_h._M_single_bucket;
  (this->voted_servers_)._M_h._M_bucket_count = 1;
  (this->voted_servers_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->voted_servers_)._M_h._M_element_count = 0;
  (this->voted_servers_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->voted_servers_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->voted_servers_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->prevote_state_)._M_t.
  super___uniq_ptr_impl<cornerstone::prevote_state,_std::default_delete<cornerstone::prevote_state>_>
  ._M_t.
  super__Tuple_impl<0UL,_cornerstone::prevote_state_*,_std::default_delete<cornerstone::prevote_state>_>
  .super__Head_base<0UL,_cornerstone::prevote_state_*,_false>._M_head_impl = (prevote_state *)0x0;
  std::random_device::random_device(&local_13b8);
  uVar11 = std::random_device::_M_getval();
  uVar14 = uVar11 / 0x7fffffff << 0x1f | uVar11 / 0x7fffffff;
  prVar5 = (ctx->params_)._M_t.
           super___uniq_ptr_impl<cornerstone::raft_params,_std::default_delete<cornerstone::raft_params>_>
           ._M_t.
           super__Tuple_impl<0UL,_cornerstone::raft_params_*,_std::default_delete<cornerstone::raft_params>_>
           .super__Head_base<0UL,_cornerstone::raft_params_*,_false>._M_head_impl;
  local_1428._M_unused._0_8_ =
       (undefined8)*(undefined8 *)&(local_1448->super__Function_base)._M_functor;
  local_1428._8_8_ = *(undefined8 *)((long)&(local_1448->super__Function_base)._M_functor + 8);
  *(ulong *)&(this->rand_timeout_).super__Function_base._M_functor =
       CONCAT44(prVar5->election_timeout_upper_bound_,prVar5->election_timeout_lower_bound_);
  *(ulong *)((long)&(this->rand_timeout_).super__Function_base._M_functor + 8) =
       (ulong)(uVar14 + uVar11 + (uint)(uVar11 + uVar14 == 0));
  local_1418 = (this->rand_timeout_).super__Function_base._M_manager;
  (this->rand_timeout_).super__Function_base._M_manager =
       std::
       _Function_handler<int_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/datatechnology[P]cornerstone/src/raft_server.cxx:92:21)>
       ::_M_manager;
  local_1410 = (this->rand_timeout_)._M_invoker;
  (this->rand_timeout_)._M_invoker =
       std::
       _Function_handler<int_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/datatechnology[P]cornerstone/src/raft_server.cxx:92:21)>
       ::_M_invoke;
  if (local_1418 != (_Manager_type)0x0) {
    (*local_1418)(&local_1428,&local_1428,__destroy_functor);
  }
  if ((ppVar1->super___shared_ptr<cornerstone::srv_state,_(__gnu_cxx::_Lock_policy)2>)._M_ptr ==
      (element_type *)0x0) {
    p_Var12 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
    p_Var12->_M_use_count = 1;
    p_Var12->_M_weak_count = 1;
    p_Var12->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00176a48;
    p_Var15 = p_Var12 + 1;
    p_Var12[1]._vptr__Sp_counted_base = (_func_int **)0x0;
    p_Var12[1]._M_use_count = -1;
    (this->state_).super___shared_ptr<cornerstone::srv_state,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)p_Var15;
    p_Var4 = (this->state_).super___shared_ptr<cornerstone::srv_state,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    (this->state_).super___shared_ptr<cornerstone::srv_state,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = p_Var12;
    if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
      p_Var15 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                (ppVar1->super___shared_ptr<cornerstone::srv_state,_(__gnu_cxx::_Lock_policy)2>).
                _M_ptr;
    }
    p_Var15->_vptr__Sp_counted_base = (_func_int **)0x0;
    p_Var15->_M_use_count = -1;
  }
  uVar6 = this->sm_commit_index_;
  iVar10 = (*((this->log_store_).
              super___shared_ptr<cornerstone::log_store,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             _vptr_log_store[3])();
  uVar18 = uVar6 + 1;
  if (uVar18 <= CONCAT44(extraout_var_01,iVar10)) {
    uVar18 = CONCAT44(extraout_var_01,iVar10);
  }
  do {
    iVar10 = (*((ppVar2->super___shared_ptr<cornerstone::log_store,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr)->_vptr_log_store[2])();
    if (CONCAT44(extraout_var_02,iVar10) <= uVar18) {
LAB_001450ee:
      peVar9 = (this->config_).
               super___shared_ptr<cornerstone::cluster_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      plVar16 = (long *)(peVar9->servers_).
                        super__List_base<std::shared_ptr<cornerstone::srv_config>,_std::allocator<std::shared_ptr<cornerstone::srv_config>_>_>
                        ._M_impl._M_node.super__List_node_base._M_next;
      plVar17 = &peVar9->servers_;
      if ((list<std::shared_ptr<cornerstone::srv_config>,_std::allocator<std::shared_ptr<cornerstone::srv_config>_>_>
           *)plVar16 != plVar17) {
        do {
          if (*(int *)plVar16[2] != this->id_) {
            iVar10 = pthread_rwlock_wrlock((pthread_rwlock_t *)&this->peers_lock_);
            if (iVar10 == 0x23) {
              std::__throw_system_error(0x23);
            }
            local_1428._8_8_ = 0;
            local_1410 = std::
                         _Function_handler<void_(cornerstone::peer_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/datatechnology[P]cornerstone/src/raft_server.cxx:134:48)>
                         ::_M_invoke;
            local_1418 = std::
                         _Function_handler<void_(cornerstone::peer_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/datatechnology[P]cornerstone/src/raft_server.cxx:134:48)>
                         ::_M_manager;
            iVar3 = ((((shared_ptr<cornerstone::srv_config> *)(plVar16 + 2))->
                     super___shared_ptr<cornerstone::srv_config,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                    )->id_;
            local_1488 = (peer *)0x0;
            local_1428._M_unused._M_object = this;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
            __shared_count<cornerstone::peer,std::allocator<cornerstone::peer>,std::shared_ptr<cornerstone::srv_config>&,cornerstone::context&,std::function<void(cornerstone::peer&)>&>
                      (a_Stack_1480,&local_1488,(allocator<cornerstone::peer> *)&local_1469,
                       (shared_ptr<cornerstone::srv_config> *)(plVar16 + 2),
                       (this->ctx_)._M_t.
                       super___uniq_ptr_impl<cornerstone::context,_std::default_delete<cornerstone::context>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cornerstone::context_*,_std::default_delete<cornerstone::context>_>
                       .super__Head_base<0UL,_cornerstone::context_*,_false>._M_head_impl,
                       (function<void_(cornerstone::peer_&)> *)&local_1428);
            local_1468 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                         CONCAT44(local_1468._4_4_,iVar3);
            local_1460 = local_1488;
            ap_Stack_1458[0] = a_Stack_1480[0]._M_pi;
            local_1488 = (peer *)0x0;
            a_Stack_1480[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            std::
            _Hashtable<int,std::pair<int_const,std::shared_ptr<cornerstone::peer>>,std::allocator<std::pair<int_const,std::shared_ptr<cornerstone::peer>>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
            ::_M_emplace<std::pair<int,std::shared_ptr<cornerstone::peer>>>(local_1440,&local_1468);
            if (ap_Stack_1458[0] != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(ap_Stack_1458[0]);
            }
            if (a_Stack_1480[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_1480[0]._M_pi);
            }
            if (local_1418 != (_Manager_type)0x0) {
              (*local_1418)(&local_1428,&local_1428,__destroy_functor);
            }
            pthread_rwlock_unlock((pthread_rwlock_t *)&this->peers_lock_);
          }
          plVar16 = (long *)*plVar16;
        } while ((list<std::shared_ptr<cornerstone::srv_config>,_std::allocator<std::shared_ptr<cornerstone::srv_config>_>_>
                  *)plVar16 != plVar17);
      }
      local_1488 = (peer *)0x0;
      local_1428._M_unused._M_object = operator_new(0x10);
      *(undefined ***)local_1428._M_unused._0_8_ = &PTR___State_00178a40;
      *(raft_server **)((long)local_1428._M_unused._0_8_ + 8) = this;
      std::thread::_M_start_thread(&local_1488,&local_1428,0);
      if ((long *)local_1428._M_unused._0_8_ != (long *)0x0) {
        (**(code **)(*local_1428._M_unused._M_object + 8))();
      }
      std::thread::detach();
      restart_election_timer(this);
      peVar8 = (this->l_).super___shared_ptr<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      ;
      local_1408 = "server %d started";
      snprintf(local_1428._M_pod_data,0x1e,"server %d started",(ulong)(uint)this->id_);
      local_1468 = ap_Stack_1458;
      sVar13 = strlen(local_1428._M_pod_data);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1468,&local_1428,(long)&local_1428 + sVar13);
      (*peVar8->_vptr_logger[2])(peVar8,&local_1468);
      if (local_1468 != ap_Stack_1458) {
        operator_delete(local_1468,(ulong)((long)&ap_Stack_1458[0]->_vptr__Sp_counted_base + 1));
      }
      if (local_1488 != (peer *)0x0) {
        std::terminate();
      }
      std::random_device::_M_fini();
      return;
    }
    peVar7 = (ppVar2->super___shared_ptr<cornerstone::log_store,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
    ;
    (*peVar7->_vptr_log_store[8])(&local_1488,peVar7,uVar18);
    if (*(int *)&(local_1488->config_).
                 super___shared_ptr<cornerstone::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                 ._M_pi == 2) {
      peVar8 = (this->l_).super___shared_ptr<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      ;
      local_13c0 = "detect a configuration change that is not committed yet at index %llu";
      snprintf(local_1428._M_pod_data,100,
               "detect a configuration change that is not committed yet at index %llu",uVar18);
      local_1468 = ap_Stack_1458;
      sVar13 = strlen(local_1428._M_pod_data);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1468,&local_1428,(long)&local_1428 + sVar13);
      (*peVar8->_vptr_logger[3])(peVar8,&local_1468);
      if (local_1468 != ap_Stack_1458) {
        operator_delete(local_1468,(ulong)((long)&ap_Stack_1458[0]->_vptr__Sp_counted_base + 1));
      }
      this->config_changing_ = true;
      if (a_Stack_1480[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_1480[0]._M_pi);
      }
      goto LAB_001450ee;
    }
    if (a_Stack_1480[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_1480[0]._M_pi);
    }
    uVar18 = uVar18 + 1;
  } while( true );
}

Assistant:

raft_server::raft_server(context* ctx)
    : leader_(-1),
      id_(ctx->state_mgr_->server_id()),
      votes_granted_(0),
      quick_commit_idx_(ctx->state_machine_->last_commit_index()),
      sm_commit_index_(ctx->state_machine_->last_commit_index()),
      election_completed_(true),
      config_changing_(false),
      catching_up_(false),
      stopping_(false),
      steps_to_down_(0),
      snp_in_progress_(),
      ctx_(ctx),
      scheduler_(ctx->scheduler_),
      election_exec_([this]() { this->handle_election_timeout(); }),
      election_task_(),
      peers_(),
      peers_lock_(),
      rpc_clients_(),
      role_(srv_role::follower),
      state_(ctx->state_mgr_->read_state()),
      log_store_(ctx->state_mgr_->load_log_store()),
      state_machine_(ctx->state_machine_),
      l_(ctx->logger_),
      config_(ctx->state_mgr_->load_config()),
      srv_to_join_(),
      conf_to_add_(),
      lock_(),
      commit_lock_(),
      rpc_clients_lock_(),
      commit_cv_(),
      stopping_lock_(),
      ready_to_stop_cv_(),
      resp_handler_([this](ptr<resp_msg>& resp, const ptr<rpc_exception>& e) { this->handle_peer_resp(resp, e); }),
      ex_resp_handler_([this](ptr<resp_msg>& resp, const ptr<rpc_exception>& e) { this->handle_ext_resp(resp, e); }),
      last_snapshot_(ctx->state_machine_->last_snapshot()),
      voted_servers_(),
      prevote_state_()
{
    std::random_device rd;
    std::default_random_engine engine(rd());
    std::uniform_int_distribution<int32> distribution(
        ctx->params_->election_timeout_lower_bound_, ctx->params_->election_timeout_upper_bound_);
    rand_timeout_ = [distribution, engine]() mutable -> int32_t { return distribution(engine); };

    if (!state_)
    {
        state_ = cs_new<srv_state>();
        state_->set_term(0);
        state_->set_voted_for(-1);
    }

    /**
     * I found this implementation is also a victim of bug https://groups.google.com/forum/#!topic/raft-dev/t4xj6dJTP6E
     * As the implementation is based on Diego's thesis
     * Fix:
     * We should never load configurations that is not committed,
     *   this prevents an old server from replicating an obsoleted config to other servers
     * The prove is as below:
     * Assume S0 is the last committed server set for the old server A
     * |- EXITS Log l which has been committed but l !BELONGS TO A.logs =>  Vote(A) < Majority(S0)
     * In other words, we need to prove that A cannot be elected to leader if any logs/configs has been committed.
     * Case #1, There is no configuration change since S0, then it's obvious that Vote(A) < Majority(S0), see the core
     * Algorithm Case #2, There are one or more configuration changes since S0, then at the time of first configuration
     * change was committed, there are at least Majority(S0 - 1) servers committed the configuration change Majority(S0
     * - 1) + Majority(S0) > S0 => Vote(A) < Majority(S0)
     * -|
     */
    for (ulong i = std::max(sm_commit_index_ + 1, log_store_->start_index()); i < log_store_->next_slot(); ++i)
    {
        ptr<log_entry> entry(log_store_->entry_at(i));
        if (entry->get_val_type() == log_val_type::conf)
        {
            l_->info(sstrfmt("detect a configuration change that is not committed yet at index %llu").fmt(i));
            config_changing_ = true;
            break;
        }
    }

    std::list<ptr<srv_config>>& srvs(config_->get_servers());
    for (cluster_config::srv_itor it = srvs.begin(); it != srvs.end(); ++it)
    {
        if ((*it)->get_id() != id_)
        {
            write_lock(peers_lock_);
            timer_task<peer&>::executor exec = [this](peer& p) { this->handle_hb_timeout(p); };
            peers_.insert(std::make_pair(
                (*it)->get_id(),
                cs_new<peer>(*it, *ctx_, exec)));
        }
    }

    std::thread commiting_thread = std::thread([this]() { this->commit_in_bg(); });
    commiting_thread.detach();
    restart_election_timer();
    l_->debug(strfmt<30>("server %d started").fmt(id_));
}